

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,
          span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_1,
          Expression *args_2,Expression *args_3,SourceRange *args_4)

{
  pointer pCVar1;
  size_type sVar2;
  ConditionalExpression *this_00;
  
  this_00 = (ConditionalExpression *)allocate(this,0x50,8);
  pCVar1 = args_1->data_;
  sVar2 = args_1->size_;
  ast::Expression::Expression((Expression *)this_00,ConditionalOp,args,*args_4);
  (this_00->conditions).data_ = pCVar1;
  (this_00->conditions).size_ = sVar2;
  this_00->left_ = args_2;
  this_00->right_ = args_3;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }